

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.h
# Opt level: O2

void __thiscall Application::Application(Application *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__Application_00151430;
  FIX::MessageCracker::MessageCracker(&this->super_MessageCracker);
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__Application_0014e028;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_0014e0a0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_0014e280;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_0014e470;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_0014e780;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_0014ebf0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_0014f1f0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_0014f7f0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_0014feb0;
  (this->super_MessageCracker).super_MessageCracker._vptr_MessageCracker =
       (_func_int **)&PTR__Application_001508a0;
  (this->m_orderMatcher).m_markets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_orderMatcher).m_markets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->m_orderMatcher).m_markets._M_t._M_impl.super__Rb_tree_header;
  (this->m_orderMatcher).m_markets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_orderMatcher).m_markets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_orderMatcher).m_markets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_generator).m_orderID = 0;
  (this->m_generator).m_executionID = 0;
  return;
}

Assistant:

void onCreate(const FIX::SessionID &) {}